

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualinfo.c
# Opt level: O0

void VisualInfo(GLContext *ctx)

{
  char *__format;
  uint local_54;
  uint local_44;
  int local_34;
  int local_30;
  int value2;
  int ret2;
  int i;
  int ret;
  int value;
  GLXFBConfig *fbc;
  GLContext *pGStack_10;
  int n_fbc;
  GLContext *ctx_local;
  
  pGStack_10 = ctx;
  _ret = (*___glewXGetFBConfigs)(ctx->dpy,*(undefined4 *)(ctx->dpy + 0xe0),(long)&fbc + 4);
  if ((_ret != 0) && (verbose == 0)) {
    fprintf((FILE *)file,
            " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n"
           );
    fprintf((FILE *)file,
            " |     |        visual           |      color      | ax dp st |    accum    |   ms  |  cav |\n"
           );
    fprintf((FILE *)file,
            " |  id | tp xr cl fm db st lv xp |  sz  r  g  b  a | bf th cl | r  g  b  a  | ns  b |  eat |\n"
           );
    fprintf((FILE *)file,
            " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n"
           );
    for (value2 = 0; value2 < fbc._4_4_; value2 = value2 + 1) {
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0x8013,&i);
      if (ret2 == 0) {
        fprintf((FILE *)file," |% 4d | ",(ulong)(uint)i);
      }
      else {
        fprintf((FILE *)file,"|  ?  |");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0x8010,&i);
      if (ret2 == 0) {
        if ((i & 1U) == 0) {
          if ((i & 4U) == 0) {
            if ((i & 2U) == 0) {
              fprintf((FILE *)file," ? ");
            }
            else {
              fprintf((FILE *)file,"pm ");
            }
          }
          else {
            fprintf((FILE *)file,"pb ");
          }
        }
        else if ((i & 4U) == 0) {
          fprintf((FILE *)file,"wn ");
        }
        else {
          fprintf((FILE *)file,"wp ");
        }
      }
      else {
        fprintf((FILE *)file," ? ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0x8012,&i);
      if (ret2 == 0) {
        __format = " n ";
        if (i != 0) {
          __format = " y ";
        }
        fprintf((FILE *)file,__format);
      }
      else {
        fprintf((FILE *)file," ? ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0x22,&i);
      if (ret2 == 0) {
        if (i == 0x8002) {
          fprintf((FILE *)file,"tc ");
        }
        else if (i == 0x8003) {
          fprintf((FILE *)file,"dc ");
        }
        else if (i == 0x8004) {
          fprintf((FILE *)file,"pc ");
        }
        else if (i == 0x8005) {
          fprintf((FILE *)file,"sc ");
        }
        else if (i == 0x8006) {
          fprintf((FILE *)file,"gs ");
        }
        else if (i == 0x8007) {
          fprintf((FILE *)file,"sg ");
        }
        else if (i == 0x22) {
          fprintf((FILE *)file," . ");
        }
        else {
          fprintf((FILE *)file," ? ");
        }
      }
      else {
        fprintf((FILE *)file," ? ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0x8011,&i);
      if (ret2 == 0) {
        if (__GLXEW_NV_float_buffer == '\0') {
          if ((i & 0x100U) == 0) {
            if ((i & 1U) == 0) {
              if ((i & 2U) == 0) {
                fprintf((FILE *)file," ? ");
              }
              else {
                fprintf((FILE *)file," c ");
              }
            }
            else {
              fprintf((FILE *)file," i ");
            }
          }
          else {
            fprintf((FILE *)file," f ");
          }
        }
        else {
          local_30 = (*___glewXGetFBConfigAttrib)
                               (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0x20b0,
                                &local_34);
          if ((local_30 == 0) && (local_34 == 1)) {
            fprintf((FILE *)file," f ");
          }
          else if ((i & 1U) == 0) {
            if ((i & 2U) == 0) {
              fprintf((FILE *)file," ? ");
            }
            else {
              fprintf((FILE *)file," c ");
            }
          }
          else {
            fprintf((FILE *)file," i ");
          }
        }
      }
      else {
        fprintf((FILE *)file," ? ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),5,&i);
      if (ret2 == 0) {
        local_44 = 0x2e;
        if (i != 0) {
          local_44 = 0x79;
        }
      }
      else {
        local_44 = 0x3f;
      }
      fprintf((FILE *)file," %c ",(ulong)local_44);
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),6,&i);
      if (ret2 == 0) {
        local_54 = 0x2e;
        if (i != 0) {
          local_54 = 0x79;
        }
      }
      else {
        local_54 = 0x3f;
      }
      fprintf((FILE *)file," %c ",(ulong)local_54);
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),3,&i);
      if (ret2 == 0) {
        fprintf((FILE *)file,"%2d ",(ulong)(uint)i);
      }
      else {
        fprintf((FILE *)file," ? ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0x23,&i);
      if (ret2 == 0) {
        if (i == 0x8008) {
          fprintf((FILE *)file," r | ");
        }
        else if (i == 0x8009) {
          fprintf((FILE *)file," i | ");
        }
        else if (i == 0x8000) {
          fprintf((FILE *)file," . | ");
        }
        else {
          fprintf((FILE *)file," ? | ");
        }
      }
      else {
        fprintf((FILE *)file," ? | ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),2,&i);
      if (ret2 == 0) {
        if (i == 0) {
          fprintf((FILE *)file,"  . ");
        }
        else {
          fprintf((FILE *)file,"%3d ",(ulong)(uint)i);
        }
      }
      else {
        fprintf((FILE *)file,"  ? ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),8,&i);
      if (ret2 == 0) {
        if (i == 0) {
          fprintf((FILE *)file," . ");
        }
        else {
          fprintf((FILE *)file,"%2d ",(ulong)(uint)i);
        }
      }
      else {
        fprintf((FILE *)file," ? ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),9,&i);
      if (ret2 == 0) {
        if (i == 0) {
          fprintf((FILE *)file," . ");
        }
        else {
          fprintf((FILE *)file,"%2d ",(ulong)(uint)i);
        }
      }
      else {
        fprintf((FILE *)file," ? ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),10,&i);
      if (ret2 == 0) {
        if (i == 0) {
          fprintf((FILE *)file," . ");
        }
        else {
          fprintf((FILE *)file,"%2d ",(ulong)(uint)i);
        }
      }
      else {
        fprintf((FILE *)file," ? ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0xb,&i);
      if (ret2 == 0) {
        if (i == 0) {
          fprintf((FILE *)file," . | ");
        }
        else {
          fprintf((FILE *)file,"%2d | ",(ulong)(uint)i);
        }
      }
      else {
        fprintf((FILE *)file," ? | ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),7,&i);
      if (ret2 == 0) {
        if (i == 0) {
          fprintf((FILE *)file," . ");
        }
        else {
          fprintf((FILE *)file,"%2d ",(ulong)(uint)i);
        }
      }
      else {
        fprintf((FILE *)file," ? ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0xc,&i);
      if (ret2 == 0) {
        if (i == 0) {
          fprintf((FILE *)file," . ");
        }
        else {
          fprintf((FILE *)file,"%2d ",(ulong)(uint)i);
        }
      }
      else {
        fprintf((FILE *)file," ? ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0xd,&i);
      if (ret2 == 0) {
        if (i == 0) {
          fprintf((FILE *)file," . | ");
        }
        else {
          fprintf((FILE *)file,"%2d | ",(ulong)(uint)i);
        }
      }
      else {
        fprintf((FILE *)file," ? | ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0xe,&i);
      if (ret2 == 0) {
        if (i == 0) {
          fprintf((FILE *)file," . ");
        }
        else {
          fprintf((FILE *)file,"%2d ",(ulong)(uint)i);
        }
      }
      else {
        fprintf((FILE *)file," ? ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0xf,&i);
      if (ret2 == 0) {
        if (i == 0) {
          fprintf((FILE *)file," . ");
        }
        else {
          fprintf((FILE *)file,"%2d ",(ulong)(uint)i);
        }
      }
      else {
        fprintf((FILE *)file," ? ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0x10,&i);
      if (ret2 == 0) {
        if (i == 0) {
          fprintf((FILE *)file," . ");
        }
        else {
          fprintf((FILE *)file,"%2d ",(ulong)(uint)i);
        }
      }
      else {
        fprintf((FILE *)file," ? ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0x11,&i);
      if (ret2 == 0) {
        if (i == 0) {
          fprintf((FILE *)file," . | ");
        }
        else {
          fprintf((FILE *)file,"%2d | ",(ulong)(uint)i);
        }
      }
      else {
        fprintf((FILE *)file," ? | ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0x186a1,&i);
      if (ret2 == 0) {
        fprintf((FILE *)file,"%2d ",(ulong)(uint)i);
      }
      else {
        fprintf((FILE *)file," ? ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),100000,&i);
      if (ret2 == 0) {
        fprintf((FILE *)file,"%2d | ",(ulong)(uint)i);
      }
      else {
        fprintf((FILE *)file," ? | ");
      }
      ret2 = (*___glewXGetFBConfigAttrib)
                       (pGStack_10->dpy,*(undefined8 *)(_ret + (long)value2 * 8),0x20,&i);
      if (ret2 == 0) {
        if (i == 0x8000) {
          fprintf((FILE *)file,"none |\n");
        }
        else if (i == 0x8001) {
          fprintf((FILE *)file,"slow |\n");
        }
        else if (i == 0x800d) {
          fprintf((FILE *)file,"ncft |\n");
        }
        else {
          fprintf((FILE *)file,"???? |\n");
        }
      }
      else {
        fprintf((FILE *)file,"???? |");
      }
    }
    fprintf((FILE *)file,
            " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n"
           );
    fprintf((FILE *)file,
            " |  id | tp xr cl fm db st lv xp |  sz  r  g  b  a | bf th cl | r  g  b  a  | ns  b |  eat |\n"
           );
    fprintf((FILE *)file,
            " |     |        visual           |      color      | ax dp st |    accum    |   ms  |  cav |\n"
           );
    fprintf((FILE *)file,
            " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n"
           );
  }
  return;
}

Assistant:

void
VisualInfo (GLContext* ctx)
{
  int n_fbc;
  GLXFBConfig* fbc;
  int value, ret, i;

  fbc = glXGetFBConfigs(ctx->dpy, DefaultScreen(ctx->dpy), &n_fbc);

  if (fbc)
  {
    if (!verbose)
    {
      /* print table header */
      fprintf(file, " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n");
      fprintf(file, " |     |        visual           |      color      | ax dp st |    accum    |   ms  |  cav |\n");
      fprintf(file, " |  id | tp xr cl fm db st lv xp |  sz  r  g  b  a | bf th cl | r  g  b  a  | ns  b |  eat |\n");
      fprintf(file, " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n");
      /* loop through all the fbcs */
      for (i=0; i<n_fbc; i++)
      {
        /* print out the information for this fbc */
        /* visual id */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_FBCONFIG_ID, &value);
        if (ret != Success)
        {
          fprintf(file, "|  ?  |");
        }
        else
        {
          fprintf(file, " |% 4d | ", value);
        }
        /* visual type */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_DRAWABLE_TYPE, &value);
        if (ret != Success)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value & GLX_WINDOW_BIT)
          {
            if (value & GLX_PBUFFER_BIT)
            {
              fprintf(file, "wp ");
            }
            else
            {
              fprintf(file, "wn ");
            }
          }
          else
          {
            if (value & GLX_PBUFFER_BIT)
            {
              fprintf(file, "pb ");
            }
            else if (value & GLX_PIXMAP_BIT)
            {
              fprintf(file, "pm ");
            }
            else
            {
              fprintf(file, " ? ");
            }
          }
        }
        /* x renderable */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_X_RENDERABLE, &value);
        if (ret != Success)
        {
          fprintf(file, " ? ");
        }
        else
        {
          fprintf(file, value ? " y " : " n ");
        }
        /* class */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_X_VISUAL_TYPE, &value);
        if (ret != Success)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (GLX_TRUE_COLOR == value)
            fprintf(file, "tc ");
          else if (GLX_DIRECT_COLOR == value)
            fprintf(file, "dc ");
          else if (GLX_PSEUDO_COLOR == value)
            fprintf(file, "pc ");
          else if (GLX_STATIC_COLOR == value)
            fprintf(file, "sc ");
          else if (GLX_GRAY_SCALE == value)
            fprintf(file, "gs ");
          else if (GLX_STATIC_GRAY == value)
            fprintf(file, "sg ");
          else if (GLX_X_VISUAL_TYPE == value)
            fprintf(file, " . ");
          else
            fprintf(file, " ? ");
        }
        /* format */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_RENDER_TYPE, &value);
        if (ret != Success)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (GLXEW_NV_float_buffer)
          {
            int ret2, value2;
            ret2 = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_FLOAT_COMPONENTS_NV, &value2);
            if (Success == ret2 && GL_TRUE == value2)
            {
              fprintf(file, " f ");
            }
            else if (value & GLX_RGBA_BIT)
              fprintf(file, " i ");
            else if (value & GLX_COLOR_INDEX_BIT)
              fprintf(file, " c ");
            else
              fprintf(file, " ? ");
          }
          else
          {
            if (value & GLX_RGBA_FLOAT_ATI_BIT)
              fprintf(file, " f ");
            else if (value & GLX_RGBA_BIT)
              fprintf(file, " i ");
            else if (value & GLX_COLOR_INDEX_BIT)
              fprintf(file, " c ");
            else
              fprintf(file, " ? ");
          }
        }
        /* double buffer */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_DOUBLEBUFFER, &value);
        fprintf(file, " %c ", Success != ret ? '?' : (value ? 'y' : '.'));
        /* stereo */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_STEREO, &value);
        fprintf(file, " %c ", Success != ret ? '?' : (value ? 'y' : '.'));
        /* level */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_LEVEL, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          fprintf(file, "%2d ", value);
        }
        /* transparency */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_TRANSPARENT_TYPE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? | ");
        }
        else
        {
          if (GLX_TRANSPARENT_RGB == value)
            fprintf(file, " r | ");
          else if (GLX_TRANSPARENT_INDEX == value)
            fprintf(file, " i | ");
          else if (GLX_NONE == value)
            fprintf(file, " . | ");
          else
            fprintf(file, " ? | ");
        }
        /* color size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_BUFFER_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, "  ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%3d ", value);
          else
            fprintf(file, "  . ");
        }
        /* red size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_RED_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* green size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_GREEN_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* blue size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_BLUE_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* alpha size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_ALPHA_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? | ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d | ", value);
          else
            fprintf(file, " . | ");
        }
        /* aux buffers */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_AUX_BUFFERS, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* depth size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_DEPTH_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* stencil size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_STENCIL_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? | ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d | ", value);
          else
            fprintf(file, " . | ");
        }
        /* accum red size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_ACCUM_RED_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* accum green size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_ACCUM_GREEN_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* accum blue size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_ACCUM_BLUE_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* accum alpha size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_ACCUM_ALPHA_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? | ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d | ", value);
          else
            fprintf(file, " . | ");
        }
        /* multisample */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_SAMPLES, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          fprintf(file, "%2d ", value);
        }
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_SAMPLE_BUFFERS, &value);
        if (Success != ret)
        {
          fprintf(file, " ? | ");
        }
        else
        {
          fprintf(file, "%2d | ", value);
        }
        /* caveat */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_CONFIG_CAVEAT, &value);
        if (Success != ret)
        {
          fprintf(file, "???? |");
        }
        else
        {
          if (GLX_NONE == value)
            fprintf(file, "none |\n");
          else if (GLX_SLOW_CONFIG == value)
            fprintf(file, "slow |\n");
          else if (GLX_NON_CONFORMANT_CONFIG == value)
            fprintf(file, "ncft |\n");
          else
            fprintf(file, "???? |\n");
        }
      }
      /* print table footer */
      fprintf(file, " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n");
      fprintf(file, " |  id | tp xr cl fm db st lv xp |  sz  r  g  b  a | bf th cl | r  g  b  a  | ns  b |  eat |\n");
      fprintf(file, " |     |        visual           |      color      | ax dp st |    accum    |   ms  |  cav |\n");
      fprintf(file, " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n");
    }
  }
}